

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cc
# Opt level: O3

uint8_t * SHA512_256(uint8_t *data,size_t len,uint8_t *out)

{
  SHA512_CTX ctx;
  SHA512_CTX SStack_f8;
  
  BCM_sha512_256_init(&SStack_f8);
  BCM_sha512_256_update(&SStack_f8,data,len);
  BCM_sha512_256_final(out,&SStack_f8);
  OPENSSL_cleanse(&SStack_f8,0xd8);
  return out;
}

Assistant:

uint8_t *SHA512_256(const uint8_t *data, size_t len,
                uint8_t out[SHA512_256_DIGEST_LENGTH]) {
  SHA512_CTX ctx;
  BCM_sha512_256_init(&ctx);
  BCM_sha512_256_update(&ctx, data, len);
  BCM_sha512_256_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}